

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec2.c
# Opt level: O2

bool_t ec2ToALD(word *b,word *a,ec_o *ec,void *stack)

{
  word *pwVar1;
  void *pvVar2;
  size_t n;
  bool_t bVar3;
  
  n = ec->f->n;
  pwVar1 = a + n;
  bVar3 = wwIsZero(pwVar1 + n,n);
  if (bVar3 == 0) {
    pvVar2 = (void *)((long)stack + n * 8);
    (*ec->f->inv)((word *)stack,pwVar1 + n,ec->f,pvVar2);
    (*ec->f->mul)(b,a,(word *)stack,ec->f,pvVar2);
    (*ec->f->sqr)((word *)stack,(word *)stack,ec->f,pvVar2);
    (*ec->f->mul)(b + n,pwVar1,(word *)stack,ec->f,pvVar2);
  }
  return (uint)(bVar3 == 0);
}

Assistant:

static bool_t ec2ToALD(word b[], const word a[], const ec_o* ec, void* stack)
{
	const size_t n = ec->f->n;
	// переменные в stack
	word* t1 = (word*)stack;
	stack = t1 + n;
	// pre
	ASSERT(ecIsOperable(ec) && ec->d == 3);
	ASSERT(ec2SeemsOn3(a, ec));
	ASSERT(a == b || wwIsDisjoint2(a, 3 * n, b, 2 * n));
	// a == O => b <- O
	if (qrIsZero(ecZ(a, n), ec->f))
		return FALSE;
	// t1 <- za^{-1}
	qrInv(t1, ecZ(a, n), ec->f, stack);
	// xb <- xa t1
	qrMul(ecX(b), ecX(a), t1, ec->f, stack);
	// t1 <- t1^2
	qrSqr(t1, t1, ec->f, stack);
	// yb <- ya t1
	qrMul(ecY(b, n), ecY(a, n), t1, ec->f, stack);
	// b != O
	return TRUE;
}